

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O3

word ** makeArray(Abc_TtStore_t *p)

{
  word **ppwVar1;
  word **ppwVar2;
  word *__dest;
  long lVar3;
  long lVar4;
  size_t __size;
  
  lVar3 = (long)p->nFuncs;
  ppwVar2 = (word **)malloc(lVar3 * 8);
  if (0 < lVar3) {
    __size = (long)p->nWords << 3;
    ppwVar1 = p->pFuncs;
    lVar4 = 0;
    do {
      __dest = (word *)malloc(__size);
      ppwVar2[lVar4] = __dest;
      memcpy(__dest,ppwVar1[lVar4],__size);
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return ppwVar2;
}

Assistant:

word** makeArray(Abc_TtStore_t* p)
{
    int i;
    word** a;
    a = (word**)malloc(sizeof(word*)*(p->nFuncs));
    for(i=0;i<p->nFuncs;i++)
    {
        a[i] = (word*)malloc(sizeof(word)*(p->nWords));
        memcpy(a[i],p->pFuncs[i],sizeof(word)*(p->nWords));

    }
    return a;
}